

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

Value * __thiscall Kvm::letToFuncApp(Kvm *this,Value *v)

{
  Value *pVVar1;
  Value *result1;
  Value *result2;
  GcGuard guard;
  Value *local_30;
  Value *local_28;
  GcGuard local_20;
  
  local_30 = (Value *)0x0;
  local_28 = (Value *)0x0;
  local_20.gc_ = &this->gc_;
  local_20.times_ = 0;
  GcGuard::pushLocalStackRoot(&local_20,&local_30);
  GcGuard::pushLocalStackRoot(&local_20,&local_28);
  local_30 = letParameters(this,v);
  local_30 = makeLambda(this,local_30,*(Value **)(*(long *)&v[1].type_ + 0x20));
  local_28 = letArguments(this,v);
  pVVar1 = makeCell(this,local_30,local_28);
  local_30 = pVVar1;
  GcGuard::~GcGuard(&local_20);
  return pVVar1;
}

Assistant:

const Value* Kvm::letToFuncApp(const Value *v)
{
    const Value *result1 = nullptr;
    const Value *result2 = nullptr;
    
    GcGuard guard{gc_};
    guard.pushLocalStackRoot(&result1);
    guard.pushLocalStackRoot(&result2);
    result1 = letParameters(v);
    result1 = makeLambda(result1, letBody(v));
    result2 = letArguments(v);
    result1 = makeFuncApplication(result1, result2);
    return result1;
}